

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSeparateShaderTests.cpp
# Opt level: O2

MovePtr<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
* __thiscall
deqp::gles31::Functional::anon_unknown_0::SeparateShaderTest::createShaderProgram
          (MovePtr<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
           *__return_storage_ptr__,SeparateShaderTest *this,string *vtxSource,string *frgSource,
          bool separable)

{
  RenderContext *renderCtx;
  ProgramWrapper *pPVar1;
  TestError *this_00;
  undefined1 auStack_128 [40];
  ProgramSources sources;
  
  memset(&sources,0,0xac);
  sources.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  sources.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  sources.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
  sources.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  sources._193_8_ = 0;
  if (vtxSource != (string *)0x0) {
    glu::VertexSource::VertexSource((VertexSource *)auStack_128,vtxSource);
    glu::ProgramSources::operator<<(&sources,(ShaderSource *)auStack_128);
    std::__cxx11::string::~string((string *)(auStack_128 + 8));
  }
  if (frgSource != (string *)0x0) {
    glu::FragmentSource::FragmentSource((FragmentSource *)auStack_128,frgSource);
    glu::ProgramSources::operator<<(&sources,(ShaderSource *)auStack_128);
    std::__cxx11::string::~string((string *)(auStack_128 + 8));
  }
  sources.separable = separable;
  pPVar1 = (ProgramWrapper *)operator_new(0xd8);
  renderCtx = ((this->super_TestCase).m_context)->m_renderCtx;
  pPVar1->_vptr_ProgramWrapper = (_func_int **)&PTR__ShaderProgramWrapper_01e52c88;
  glu::ShaderProgram::ShaderProgram((ShaderProgram *)(pPVar1 + 1),renderCtx,&sources);
  if (*(char *)&pPVar1[0x19]._vptr_ProgramWrapper != '\0') {
    (__return_storage_ptr__->
    super_UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
    ).m_data.ptr = pPVar1;
    glu::ProgramSources::~ProgramSources(&sources);
    return __return_storage_ptr__;
  }
  tcu::TestLog::writeMessage
            (((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
             "Couldn\'t create shader program");
  (*pPVar1->_vptr_ProgramWrapper[3])
            (pPVar1,((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log);
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,"Couldn\'t create shader program",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fSeparateShaderTests.cpp"
             ,0x454);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

MovePtr<ProgramWrapper> SeparateShaderTest::createShaderProgram (const string*	vtxSource,
																 const string*	frgSource,
																 bool			separable)
{
	ProgramSources sources;

	if (vtxSource != DE_NULL)
		sources << VertexSource(*vtxSource);
	if (frgSource != DE_NULL)
		sources << FragmentSource(*frgSource);
	sources << ProgramSeparable(separable);

	MovePtr<ShaderProgramWrapper> wrapper (new ShaderProgramWrapper(getRenderContext(),
																	sources));
	if (!wrapper->getShaderProgram().isOk())
	{
		log().writeMessage("Couldn't create shader program");
		wrapper->writeToLog(log());
		TCU_FAIL("Couldn't create shader program");
	}

	return MovePtr<ProgramWrapper>(wrapper.release());
}